

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O3

NULLCAutoArray * __thiscall
NULLCTypeInfo::GetArrayByName
          (NULLCAutoArray *__return_storage_ptr__,NULLCTypeInfo *this,NULLCArray name,uint size)

{
  TypeID typeID;
  NULLCArray NVar1;
  
  *(undefined8 *)__return_storage_ptr__ = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->ptr + 4) = 0;
  NVar1.len = (uint)this;
  NVar1.ptr = (char *)this;
  typeID = GetType(NVar1);
  if (typeID.typeID != 0) {
    NVar1 = nullcAllocateArrayTyped(typeID.typeID,name.len);
    __return_storage_ptr__->len = name.len;
    __return_storage_ptr__->typeID = typeID.typeID;
    __return_storage_ptr__->ptr = NVar1.ptr;
  }
  return __return_storage_ptr__;
}

Assistant:

NULLCAutoArray GetArrayByName(NULLCArray name, unsigned size)
	{
		NULLCAutoArray r = { 0, 0, 0 };

		TypeID id = GetType(name);
		if(!id.typeID)
			return r;

		NULLCArray arr = nullcAllocateArrayTyped(id.typeID, size);
		r.len = size;
		r.typeID = id.typeID;
		r.ptr = arr.ptr;
		return r;
	}